

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O2

void __thiscall
Assimp::FBX::MeshGeometry::MeshGeometry
          (MeshGeometry *this,uint64_t id,Element *element,string *name,Document *doc)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_01;
  uint uVar1;
  uint uVar2;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
  *this_02;
  pointer puVar3;
  pointer piVar4;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
  _Var5;
  Document *pDVar6;
  int iVar7;
  long lVar8;
  Element *el;
  Element *el_00;
  uint *puVar9;
  Scope *layer;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>
  _Var10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint count;
  allocator local_e9;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tempVerts;
  string local_c8;
  vector<int,_std::allocator<int>_> tempFaces;
  char *err;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
  local_50;
  Document *local_40;
  ulong local_38;
  
  local_40 = doc;
  Geometry::Geometry(&this->super_Geometry,id,element,name,doc);
  (this->super_Geometry).super_Object._vptr_Object = (_func_int **)&PTR__MeshGeometry_00868070;
  memset(&this->m_materials,0,0xa8);
  lVar8 = 0x110;
  do {
    *(long *)((long)this + lVar8 + -0x10) =
         (long)&(this->super_Geometry).super_Object._vptr_Object + lVar8;
    *(undefined8 *)((long)this + lVar8 + -8) = 0;
    *(undefined1 *)((long)&(this->super_Geometry).super_Object._vptr_Object + lVar8) = 0;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0x210);
  this_00 = &this->m_mapping_counts;
  this_01 = &this->m_mapping_offsets;
  memset(this->m_uvs,0,0x1c8);
  this_02 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
             *)(element->compound)._M_t.
               super___uniq_ptr_impl<Assimp::FBX::Scope,_std::default_delete<Assimp::FBX::Scope>_>.
               _M_t.
               super__Tuple_impl<0UL,_Assimp::FBX::Scope_*,_std::default_delete<Assimp::FBX::Scope>_>
               .super__Head_base<0UL,_Assimp::FBX::Scope_*,_false>._M_head_impl;
  if (this_02 !=
      (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
       *)0x0) {
    std::__cxx11::string::string((string *)&local_c8,"Vertices",(allocator *)&tempVerts);
    el = GetRequiredElement((Scope *)this_02,&local_c8,element);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string((string *)&local_c8,"PolygonVertexIndex",(allocator *)&tempVerts);
    el_00 = GetRequiredElement((Scope *)this_02,&local_c8,element);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::string((string *)&local_c8,"Layer",(allocator *)&tempVerts);
    local_50 = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::FBX::Element_*>_>_>
               ::equal_range(this_02,&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
    tempVerts.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    tempVerts.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    tempVerts.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    ParseVectorDataArray(&tempVerts,el);
    if (tempVerts.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_start ==
        tempVerts.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
        .super__Vector_impl_data._M_finish) {
      LogFunctions<Assimp::FBXImporter>::LogWarn((char *)0x51c73e);
    }
    tempFaces.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    tempFaces.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    tempFaces.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    ParseVectorDataArray(&tempFaces,el_00);
    if (tempFaces.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start ==
        tempFaces.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      LogFunctions<Assimp::FBXImporter>::LogWarn((char *)0x51c776);
    }
    std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
              (&this->m_vertices,
               (long)tempFaces.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)tempFaces.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
              (&this->m_faces,
               (ulong)((long)tempFaces.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)tempFaces.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start >> 2) / 3);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (this_01,((long)tempVerts.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)tempVerts.
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0xc);
    local_c8._M_dataplus._M_p._0_4_ = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (this_00,((long)tempVerts.
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)tempVerts.
                             super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) / 0xc,
               (value_type_conflict3 *)&local_c8);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->m_mappings,
               (long)tempFaces.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)tempFaces.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2);
    piVar4 = tempFaces.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
             ._M_finish;
    local_38 = ((long)tempVerts.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)tempVerts.
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0xc;
    count = 0;
    puVar9 = (uint *)tempFaces.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
    while( true ) {
      pDVar6 = local_40;
      if (puVar9 == (uint *)piVar4) {
        uVar11 = 0;
        _Var5._M_node = local_50.second._M_node;
        for (lVar8 = 0;
            ((long)tempVerts.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
            (long)tempVerts.
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
                  .super__Vector_impl_data._M_start) / 0xc != lVar8; lVar8 = lVar8 + 1) {
          (this_01->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar8] = uVar11;
          puVar3 = (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          uVar11 = uVar11 + puVar3[lVar8];
          puVar3[lVar8] = 0;
        }
        uVar11 = 0;
        for (puVar9 = (uint *)tempFaces.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start;
            puVar9 != (uint *)tempFaces.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish; puVar9 = puVar9 + 1) {
          uVar12 = (int)*puVar9 >> 0x1f ^ *puVar9;
          puVar3 = (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          uVar1 = puVar3[(int)uVar12];
          uVar2 = (this_01->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                  .super__Vector_impl_data._M_start[(int)uVar12];
          puVar3[(int)uVar12] = uVar1 + 1;
          (this->m_mappings).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
          .super__Vector_impl_data._M_start[uVar1 + uVar2] = uVar11;
          uVar11 = uVar11 + 1;
        }
        _Var10._M_node = local_50.first._M_node;
        while( true ) {
          if (_Var10._M_node == _Var5._M_node) {
            std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                      (&tempFaces.super__Vector_base<int,_std::allocator<int>_>);
            std::_Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::~_Vector_base
                      (&tempVerts.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>);
            return;
          }
          iVar7 = ParseTokenAsInt((Token *)**(undefined8 **)(*(long *)(_Var10._M_node + 2) + 8),&err
                                 );
          if (err != (char *)0x0) break;
          if ((iVar7 == 0) || (pDVar6->settings->readAllLayers != false)) {
            layer = GetRequiredScope(*(Element **)(_Var10._M_node + 2));
            ReadLayer(this,layer);
          }
          else {
            LogFunctions<Assimp::FBXImporter>::LogWarn((char *)0x51c99d);
          }
          _Var10._M_node = (_Base_ptr)std::_Rb_tree_increment(_Var10._M_node);
        }
        std::__cxx11::string::string((string *)&local_c8,err,&local_e9);
        Util::DOMError(&local_c8,element);
      }
      uVar11 = *puVar9;
      uVar13 = (ulong)(int)((int)uVar11 >> 0x1f ^ uVar11);
      if (local_38 <= uVar13) break;
      std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
                (&this->m_vertices,
                 tempVerts.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start + uVar13);
      count = count + 1;
      puVar3 = (this_00->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start + uVar13;
      *puVar3 = *puVar3 + 1;
      if ((int)uVar11 < 0) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&this->m_faces,&count);
        count = 0;
      }
      puVar9 = puVar9 + 1;
    }
    std::__cxx11::string::string
              ((string *)&local_c8,"polygon vertex index out of range",(allocator *)&err);
    Util::DOMError(&local_c8,el_00);
  }
  std::__cxx11::string::string
            ((string *)&local_c8,"failed to read Geometry object (class: Mesh), no data scope found"
             ,(allocator *)&tempVerts);
  Util::DOMError(&local_c8,(Element *)0x0);
}

Assistant:

MeshGeometry::MeshGeometry(uint64_t id, const Element& element, const std::string& name, const Document& doc)
: Geometry(id, element,name, doc)
{
    const Scope* sc = element.Compound();
    if (!sc) {
        DOMError("failed to read Geometry object (class: Mesh), no data scope found");
    }

    // must have Mesh elements:
    const Element& Vertices = GetRequiredElement(*sc,"Vertices",&element);
    const Element& PolygonVertexIndex = GetRequiredElement(*sc,"PolygonVertexIndex",&element);

    // optional Mesh elements:
    const ElementCollection& Layer = sc->GetCollection("Layer");

    std::vector<aiVector3D> tempVerts;
    ParseVectorDataArray(tempVerts,Vertices);

    if(tempVerts.empty()) {
        FBXImporter::LogWarn("encountered mesh with no vertices");
    }

    std::vector<int> tempFaces;
    ParseVectorDataArray(tempFaces,PolygonVertexIndex);

    if(tempFaces.empty()) {
        FBXImporter::LogWarn("encountered mesh with no faces");
    }

    m_vertices.reserve(tempFaces.size());
    m_faces.reserve(tempFaces.size() / 3);

    m_mapping_offsets.resize(tempVerts.size());
    m_mapping_counts.resize(tempVerts.size(),0);
    m_mappings.resize(tempFaces.size());

    const size_t vertex_count = tempVerts.size();

    // generate output vertices, computing an adjacency table to
    // preserve the mapping from fbx indices to *this* indexing.
    unsigned int count = 0;
    for(int index : tempFaces) {
        const int absi = index < 0 ? (-index - 1) : index;
        if(static_cast<size_t>(absi) >= vertex_count) {
            DOMError("polygon vertex index out of range",&PolygonVertexIndex);
        }

        m_vertices.push_back(tempVerts[absi]);
        ++count;

        ++m_mapping_counts[absi];

        if (index < 0) {
            m_faces.push_back(count);
            count = 0;
        }
    }

    unsigned int cursor = 0;
    for (size_t i = 0, e = tempVerts.size(); i < e; ++i) {
        m_mapping_offsets[i] = cursor;
        cursor += m_mapping_counts[i];

        m_mapping_counts[i] = 0;
    }

    cursor = 0;
    for(int index : tempFaces) {
        const int absi = index < 0 ? (-index - 1) : index;
        m_mappings[m_mapping_offsets[absi] + m_mapping_counts[absi]++] = cursor++;
    }

    // if settings.readAllLayers is true:
    //  * read all layers, try to load as many vertex channels as possible
    // if settings.readAllLayers is false:
    //  * read only the layer with index 0, but warn about any further layers
    for (ElementMap::const_iterator it = Layer.first; it != Layer.second; ++it) {
        const TokenList& tokens = (*it).second->Tokens();

        const char* err;
        const int index = ParseTokenAsInt(*tokens[0], err);
        if(err) {
            DOMError(err,&element);
        }

        if(doc.Settings().readAllLayers || index == 0) {
            const Scope& layer = GetRequiredScope(*(*it).second);
            ReadLayer(layer);
        }
        else {
            FBXImporter::LogWarn("ignoring additional geometry layers");
        }
    }
}